

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

PArray * NewArray(PType *type,uint count)

{
  uint uVar1;
  size_t in_RAX;
  PArray *this;
  size_t bucket;
  size_t local_28;
  
  local_28 = in_RAX;
  this = (PArray *)
         FTypeTable::FindType
                   (&TypeTable,PArray::RegistrationInfo.MyClass,(intptr_t)type,(ulong)count,
                    &local_28);
  if (this == (PArray *)0x0) {
    this = (PArray *)
           M_Malloc_Dbg(0x90,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                        ,0x1f7);
    PType::PType((PType *)this);
    (this->super_PCompoundType).super_PType.super_DObject._vptr_DObject =
         (_func_int **)&PTR_StaticType_0086de18;
    this->ElementType = type;
    this->ElementCount = count;
    uVar1 = type->Align;
    (this->super_PCompoundType).super_PType.Align = uVar1;
    uVar1 = -uVar1 & (*(int *)&(type->super_DObject).field_0x24 + uVar1) - 1;
    this->ElementSize = uVar1;
    *(uint *)&(this->super_PCompoundType).super_PType.super_DObject.field_0x24 = uVar1 * count;
    FTypeTable::AddType(&TypeTable,(PType *)this,PArray::RegistrationInfo.MyClass,(intptr_t)type,
                        (ulong)count,local_28);
  }
  return this;
}

Assistant:

PArray *NewArray(PType *type, unsigned int count)
{
	size_t bucket;
	PType *atype = TypeTable.FindType(RUNTIME_CLASS(PArray), (intptr_t)type, count, &bucket);
	if (atype == NULL)
	{
		atype = new PArray(type, count);
		TypeTable.AddType(atype, RUNTIME_CLASS(PArray), (intptr_t)type, count, bucket);
	}
	return (PArray *)atype;
}